

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  char cVar1;
  ImGuiContext *pIVar2;
  size_t sVar3;
  int *compressed_ttf_data;
  int *piVar4;
  ImFont *pIVar5;
  int compressed_ttf_size;
  
  sVar3 = strlen(compressed_ttf_data_base85);
  pIVar2 = GImGui;
  compressed_ttf_size = ((int)sVar3 + 4) / 5 << 2;
  piVar4 = &(GImGui->IO).MetricsAllocs;
  *piVar4 = *piVar4 + 1;
  compressed_ttf_data = (int *)(*(pIVar2->IO).MemAllocFn)((long)compressed_ttf_size);
  piVar4 = compressed_ttf_data;
  while( true ) {
    cVar1 = *compressed_ttf_data_base85;
    if (cVar1 == '\0') break;
    *piVar4 = (((((0x5b < compressed_ttf_data_base85[4] ^ 0xffffffdd) +
                 (int)compressed_ttf_data_base85[4]) * 0x55 +
                (0x5b < compressed_ttf_data_base85[3] ^ 0xffffffdd) +
                (int)compressed_ttf_data_base85[3]) * 0x55 +
               (0x5b < compressed_ttf_data_base85[2] ^ 0xffffffdd) +
               (int)compressed_ttf_data_base85[2]) * 0x55 +
              (0x5b < compressed_ttf_data_base85[1] ^ 0xffffffdd) +
              (int)compressed_ttf_data_base85[1]) * 0x55 + ('[' < cVar1 ^ 0xffffffdd) + (int)cVar1;
    compressed_ttf_data_base85 = compressed_ttf_data_base85 + 5;
    piVar4 = piVar4 + 1;
  }
  pIVar5 = AddFontFromMemoryCompressedTTF
                     (this,compressed_ttf_data,compressed_ttf_size,size_pixels,font_cfg,glyph_ranges
                     );
  ImGui::MemFree(compressed_ttf_data);
  return pIVar5;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = ImGui::MemAlloc((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    ImGui::MemFree(compressed_ttf);
    return font;
}